

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O3

int fmt::v11::detail::parse_nonnegative_int<char>(char **begin,char *end,int error_value)

{
  char *pcVar1;
  char *pcVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  char cVar6;
  char *pcVar7;
  
  pcVar1 = *begin;
  cVar6 = *pcVar1;
  uVar3 = 0;
  pcVar7 = pcVar1;
  do {
    pcVar2 = pcVar7;
    pcVar7 = pcVar2 + 1;
    uVar5 = (ulong)uVar3;
    uVar3 = ((int)cVar6 + uVar3 * 10) - 0x30;
    pcVar4 = end;
    if (pcVar7 == end) break;
    cVar6 = *pcVar7;
    pcVar4 = pcVar7;
  } while ((byte)(cVar6 - 0x30U) < 10);
  *begin = pcVar4;
  if ((9 < (long)pcVar4 - (long)pcVar1) &&
     (((long)pcVar4 - (long)pcVar1 != 10 ||
      (((ulong)((int)*pcVar2 - 0x30U & 0xfffffffe) + uVar5 * 10 & 0xffffffff80000000) != 0)))) {
    uVar3 = error_value;
  }
  return uVar3;
}

Assistant:

FMT_CONSTEXPR auto parse_nonnegative_int(const Char*& begin, const Char* end,
                                         int error_value) noexcept -> int {
  FMT_ASSERT(begin != end && '0' <= *begin && *begin <= '9', "");
  unsigned value = 0, prev = 0;
  auto p = begin;
  do {
    prev = value;
    value = value * 10 + unsigned(*p - '0');
    ++p;
  } while (p != end && '0' <= *p && *p <= '9');
  auto num_digits = p - begin;
  begin = p;
  int digits10 = static_cast<int>(sizeof(int) * CHAR_BIT * 3 / 10);
  if (num_digits <= digits10) return static_cast<int>(value);
  // Check for overflow.
  unsigned max = INT_MAX;
  return num_digits == digits10 + 1 &&
                 prev * 10ull + unsigned(p[-1] - '0') <= max
             ? static_cast<int>(value)
             : error_value;
}